

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  undefined4 in_register_00000014;
  int nCwd;
  char *zOut_local;
  int nOut_local;
  char *zPath_local;
  sqlite3_vfs *pVfs_local;
  
  zOut[nOut + -1] = '\0';
  if (*zPath == '/') {
    sqlite3_snprintf(nOut,zOut,"%s",zPath);
  }
  else {
    lVar2 = (*aSyscall[3].pCurrent)
                      (zOut,(long)(int)(nOut - 1U),CONCAT44(in_register_00000014,nOut),
                       (ulong)(nOut - 1U));
    if (lVar2 == 0) {
      iVar1 = sqlite3CantopenError(28999);
      iVar1 = unixLogErrorAtLine(iVar1,"getcwd",zPath,28999);
      return iVar1;
    }
    sVar3 = strlen(zOut);
    sqlite3_snprintf(nOut - (int)sVar3,zOut + (int)sVar3,"/%s",zPath);
  }
  return 0;
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing. This function could fail if, for example, the
  ** current working directory has been unlinked.
  */
  SimulateIOError( return SQLITE_ERROR );

  assert( pVfs->mxPathname==MAX_PATHNAME );
  UNUSED_PARAMETER(pVfs);

  zOut[nOut-1] = '\0';
  if( zPath[0]=='/' ){
    sqlite3_snprintf(nOut, zOut, "%s", zPath);
  }else{
    int nCwd;
    if( osGetcwd(zOut, nOut-1)==0 ){
      return unixLogError(SQLITE_CANTOPEN_BKPT, "getcwd", zPath);
    }
    nCwd = (int)strlen(zOut);
    sqlite3_snprintf(nOut-nCwd, &zOut[nCwd], "/%s", zPath);
  }
  return SQLITE_OK;
}